

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_ConstructEmpty_Test::~SingleArena_ConstructEmpty_Test
          (SingleArena_ConstructEmpty_Test *this)

{
  SingleArena_ConstructEmpty_Test *this_local;
  
  ~SingleArena_ConstructEmpty_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(SingleArena, ConstructEmpty) {
  auto arena = GetArena();
  ArenaStringPtr field(arena.get());

  EXPECT_EQ(field.Get(), "");
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_FALSE(field.IsDefault());
  } else {
    EXPECT_TRUE(field.IsDefault());
  }
  if (arena == nullptr) field.Destroy();
}